

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O1

t_int * clip_perform(t_int *w)

{
  float fVar1;
  t_int tVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  
  tVar2 = w[4];
  if ((int)tVar2 != 0) {
    lVar3 = w[3];
    lVar4 = w[1];
    lVar5 = w[2];
    lVar6 = 0;
    do {
      fVar7 = *(float *)(lVar4 + 0x34);
      fVar8 = *(float *)(lVar4 + 0x38);
      fVar1 = *(float *)(lVar5 + lVar6 * 4);
      if (fVar7 <= fVar1) {
        fVar7 = fVar1;
      }
      if (fVar7 <= fVar8) {
        fVar8 = fVar7;
      }
      *(float *)(lVar3 + lVar6 * 4) = fVar8;
      lVar6 = lVar6 + 1;
    } while ((int)tVar2 != (int)lVar6);
  }
  return w + 5;
}

Assistant:

static t_int *clip_perform(t_int *w)
{
    t_clip *x = (t_clip *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--)
    {
        t_sample f = *in++;
        if (f < x->x_lo) f = x->x_lo;
        if (f > x->x_hi) f = x->x_hi;
        *out++ = f;
    }
    return (w+5);
}